

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O0

gnode_t * gnode_label_stat_create(gtoken_s token,gnode_t *expr,gnode_t *stmt,gnode_t *decl)

{
  gnode_t *pgVar1;
  gnode_label_stmt_t *node;
  gnode_t *decl_local;
  gnode_t *stmt_local;
  gnode_t *expr_local;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x60);
  pgVar1->tag = NODE_LABEL_STAT;
  memcpy(&pgVar1->token,&token,0x28);
  pgVar1->decl = decl;
  *(gnode_t **)(pgVar1 + 1) = expr;
  *(gnode_t **)&pgVar1[1].block_length = stmt;
  return pgVar1;
}

Assistant:

gnode_t *gnode_label_stat_create (gtoken_s token, gnode_t *expr, gnode_t *stmt, gnode_t *decl) {
    gnode_label_stmt_t *node = (gnode_label_stmt_t *)mem_alloc(NULL, sizeof(gnode_label_stmt_t));

    SETBASE(node, NODE_LABEL_STAT, token);
    SETDECL(node, decl);
    node->expr = expr;
    node->stmt = stmt;
    return (gnode_t *)node;
}